

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_NtkLevelReverse(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  uint local_20;
  int local_1c;
  int LevelsMax;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  for (local_1c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_1c);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff;
  }
  local_20 = 0;
  Abc_NtkIncrementTravId(pNtk);
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_1c);
    if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
       (Abc_NtkLevelReverse_rec(pAVar2), local_20 < *(uint *)&pAVar2->field_0x14 >> 0xc)) {
      local_20 = *(uint *)&pAVar2->field_0x14 >> 0xc;
    }
  }
  return local_20;
}

Assistant:

int Abc_NtkLevelReverse( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CO levels to zero
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->Level = 0;
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Abc_NtkLevelReverse_rec( pNode );
        if ( LevelsMax < (int)pNode->Level )
            LevelsMax = (int)pNode->Level;
    }
    return LevelsMax;
}